

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::enqueuePart
          (QPDFWriter *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part)

{
  bool bVar1;
  QPDFObjectHandle local_48;
  reference local_38;
  QPDFObjectHandle *oh;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *part_local;
  QPDFWriter *this_local;
  
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(part);
  oh = (QPDFObjectHandle *)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(part);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&oh);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
    QPDFObjectHandle::QPDFObjectHandle(&local_48,local_38);
    enqueueObject(this,&local_48);
    QPDFObjectHandle::~QPDFObjectHandle(&local_48);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void
QPDFWriter::enqueuePart(std::vector<QPDFObjectHandle>& part)
{
    for (auto const& oh: part) {
        enqueueObject(oh);
    }
}